

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall
ChainstateManager::AcceptBlockHeader
          (ChainstateManager *this,CBlockHeader *block,BlockValidationState *state,
          CBlockIndex **ppindex,bool min_pow_checked)

{
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string *psVar1;
  bool bVar2;
  byte bVar3;
  pointer ppVar4;
  reference ppVar5;
  reference ppCVar6;
  CBlockIndex *pCVar7;
  CBlockIndex *pCVar8;
  undefined8 *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<CBlockIndex_*>,_bool> pVar9;
  CBlockIndex *pindex;
  CBlockIndex *failedit;
  set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_> *__range3;
  CBlockIndex *pindexPrev;
  CBlockIndex *pindex_1;
  CBlockIndex *invalid_walk;
  iterator __end3;
  iterator __begin3;
  iterator mi;
  iterator miSelf;
  string msg;
  uint256 hash;
  undefined4 in_stack_fffffffffffff978;
  undefined4 uVar10;
  int in_stack_fffffffffffff97c;
  char *in_stack_fffffffffffff980;
  char *in_stack_fffffffffffff988;
  CBlockIndex *in_stack_fffffffffffff990;
  BlockValidationResult BVar11;
  CBlockHeader *in_stack_fffffffffffff998;
  CBlockIndex **in_stack_fffffffffffff9a8;
  undefined5 in_stack_fffffffffffff9b0;
  undefined1 in_stack_fffffffffffff9b5;
  undefined1 in_stack_fffffffffffff9b6;
  undefined1 in_stack_fffffffffffff9b7;
  BlockManager *in_stack_fffffffffffff9b8;
  undefined7 in_stack_fffffffffffff9c0;
  undefined1 in_stack_fffffffffffff9c7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Params *in_stack_fffffffffffff9d0;
  BlockValidationState *in_stack_fffffffffffff9d8;
  CBlockHeader *in_stack_fffffffffffff9e0;
  undefined8 in_stack_fffffffffffff9e8;
  int iVar12;
  ChainstateManager *in_stack_fffffffffffffa20;
  ConstevalFormatString<2U> in_stack_fffffffffffffa28;
  undefined7 in_stack_fffffffffffffa30;
  undefined1 in_stack_fffffffffffffa37;
  char *in_stack_fffffffffffffa38;
  size_t in_stack_fffffffffffffa40;
  char *in_stack_fffffffffffffa48;
  CBlockIndex *in_stack_fffffffffffffaa0;
  ChainstateManager *in_stack_fffffffffffffaa8;
  BlockManager *in_stack_fffffffffffffab0;
  BlockValidationState *in_stack_fffffffffffffab8;
  char *pcVar13;
  CBlockHeader *in_stack_fffffffffffffac0;
  Level LVar14;
  undefined7 in_stack_fffffffffffffb40;
  undefined1 in_stack_fffffffffffffb47;
  undefined1 local_472 [40];
  allocator<char> local_44a;
  allocator<char> local_449 [33];
  CBlockIndex *local_428;
  _Base_ptr local_420;
  _Base_ptr local_418;
  allocator<char> local_3ea;
  allocator<char> local_3e9 [39];
  allocator<char> local_3c2;
  allocator<char> local_3c1 [33];
  _Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true> local_3a0;
  _Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true> local_398;
  allocator<char> local_36a;
  allocator<char> local_369 [33];
  _Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true> local_348;
  _Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true> local_340;
  _Base_ptr local_338;
  undefined1 local_330;
  char local_328 [128];
  undefined1 local_2a8 [128];
  CBlockIndex local_228;
  undefined1 local_188 [128];
  undefined1 local_108 [192];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            (in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff97c,
             (AnnotatedMixin<std::recursive_mutex> *)0x7e1077);
  CBlockHeader::GetHash(in_stack_fffffffffffff998);
  local_340._M_cur =
       (__node_type *)
       std::
       unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
       ::find((unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
               *)in_stack_fffffffffffff980,
              (key_type *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
  GetConsensus((ChainstateManager *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
  bVar2 = ::operator!=((base_blob<256U> *)in_stack_fffffffffffff988,
                       (base_blob<256U> *)in_stack_fffffffffffff980);
  iVar12 = (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20);
  if (bVar2) {
    local_348._M_cur =
         (__node_type *)
         std::
         unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
         ::end((unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
                *)in_stack_fffffffffffff980);
    bVar2 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true> *)
                       in_stack_fffffffffffff988,
                       (_Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true> *)
                       in_stack_fffffffffffff980);
    iVar12 = (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      ppVar4 = std::__detail::_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> *)
                          CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
      if (in_RCX != (undefined8 *)0x0) {
        *in_RCX = &ppVar4->second;
      }
      if (((ppVar4->second).nStatus & 0x60) == 0) {
        bVar3 = 1;
      }
      else {
        bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                                    Trace);
        LVar14 = (Level)in_RCX;
        if (bVar2) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff998,
                     (char *)in_stack_fffffffffffff990);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff998,
                     (char *)in_stack_fffffffffffff990);
          in_stack_fffffffffffff990 = (CBlockIndex *)&stack0xffffffffffffffb8;
          base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff980);
          in_stack_fffffffffffff988 = "AcceptBlockHeader";
          in_stack_fffffffffffff980 = "%s: block %s is marked invalid\n";
          in_stack_fffffffffffff978 = 1;
          logging_function._M_str = in_stack_fffffffffffffa48;
          logging_function._M_len = in_stack_fffffffffffffa40;
          source_file._M_len._7_1_ = in_stack_fffffffffffffa37;
          source_file._M_len._0_7_ = in_stack_fffffffffffffa30;
          source_file._M_str = in_stack_fffffffffffffa38;
          LogPrintFormatInternal<char[18],std::__cxx11::string>
                    (logging_function,source_file,iVar12,(LogFlags)in_stack_fffffffffffff9e0,LVar14,
                     in_stack_fffffffffffffa28,(char (*) [18])in_RSI,in_RDI);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
        }
        BVar11 = (BlockValidationResult)((ulong)in_stack_fffffffffffff990 >> 0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff9c8,
                   (char *)CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0),
                   (allocator<char> *)in_stack_fffffffffffff9b8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff9c8,
                   (char *)CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0),
                   (allocator<char> *)in_stack_fffffffffffff9b8);
        bVar3 = ValidationState<BlockValidationResult>::Invalid
                          ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffff998,
                           BVar11,(string *)in_stack_fffffffffffff988,
                           (string *)in_stack_fffffffffffff980);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
        std::allocator<char>::~allocator(&local_36a);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
        std::allocator<char>::~allocator(local_369);
      }
      goto LAB_007e2680;
    }
    GetConsensus((ChainstateManager *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978))
    ;
    bVar2 = CheckBlockHeader(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                             in_stack_fffffffffffff9d0,
                             SUB81((ulong)in_stack_fffffffffffff9c8 >> 0x38,0));
    iVar12 = (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20);
    if (!bVar2) {
      bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                                  Trace);
      LVar14 = (Level)in_RCX;
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff998,
                   (char *)in_stack_fffffffffffff990);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff998,
                   (char *)in_stack_fffffffffffff990);
        base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff980);
        ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                  ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffff9b8);
        uVar10 = 1;
        logging_function_00._M_str = in_stack_fffffffffffffa48;
        logging_function_00._M_len = in_stack_fffffffffffffa40;
        source_file_00._M_len._7_1_ = in_stack_fffffffffffffa37;
        source_file_00._M_len._0_7_ = in_stack_fffffffffffffa30;
        source_file_00._M_str = in_stack_fffffffffffffa38;
        LogPrintFormatInternal<char[18],std::__cxx11::string,std::__cxx11::string>
                  (logging_function_00,source_file_00,iVar12,(LogFlags)in_stack_fffffffffffff9e0,
                   LVar14,(ConstevalFormatString<3U>)in_stack_fffffffffffffa28.fmt,
                   (char (*) [18])in_RSI,in_RDI,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff97c,uVar10));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff97c,uVar10));
      }
      bVar3 = 0;
      goto LAB_007e2680;
    }
    local_398._M_cur =
         (__node_type *)
         std::
         unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
         ::find((unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
                 *)in_stack_fffffffffffff980,
                (key_type *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
    local_3a0._M_cur =
         (__node_type *)
         std::
         unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
         ::end((unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
                *)in_stack_fffffffffffff980);
    bVar2 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true> *)
                       in_stack_fffffffffffff988,
                       (_Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true> *)
                       in_stack_fffffffffffff980);
    iVar12 = (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20);
    if (bVar2) {
      bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                                  Trace);
      LVar14 = (Level)in_RCX;
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff998,
                   (char *)in_stack_fffffffffffff990);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff998,
                   (char *)in_stack_fffffffffffff990);
        base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff980);
        base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff980);
        in_stack_fffffffffffff990 = (CBlockIndex *)local_108;
        in_stack_fffffffffffff988 = local_108 + 0x20;
        in_stack_fffffffffffff980 = "header %s has prev block not found: %s\n";
        in_stack_fffffffffffff978 = 1;
        logging_function_01._M_str = in_stack_fffffffffffffa48;
        logging_function_01._M_len = in_stack_fffffffffffffa40;
        source_file_01._M_len._7_1_ = in_stack_fffffffffffffa37;
        source_file_01._M_len._0_7_ = in_stack_fffffffffffffa30;
        source_file_01._M_str = in_stack_fffffffffffffa38;
        LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                  (logging_function_01,source_file_01,iVar12,(LogFlags)in_stack_fffffffffffff9e0,
                   LVar14,in_stack_fffffffffffffa28,in_RSI,in_RDI);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
      }
      BVar11 = (BlockValidationResult)((ulong)in_stack_fffffffffffff990 >> 0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff9c8,
                 (char *)CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0),
                 (allocator<char> *)in_stack_fffffffffffff9b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff9c8,
                 (char *)CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0),
                 (allocator<char> *)in_stack_fffffffffffff9b8);
      bVar3 = ValidationState<BlockValidationResult>::Invalid
                        ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffff998,BVar11,
                         (string *)in_stack_fffffffffffff988,(string *)in_stack_fffffffffffff980);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
      std::allocator<char>::~allocator(&local_3c2);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
      std::allocator<char>::~allocator(local_3c1);
      goto LAB_007e2680;
    }
    ppVar5 = std::__detail::_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>::
             operator*((_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> *)
                       CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
    iVar12 = (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20);
    if (((ppVar5->second).nStatus & 0x60) != 0) {
      bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                                  Trace);
      LVar14 = (Level)in_RCX;
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff998,
                   (char *)in_stack_fffffffffffff990);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff998,
                   (char *)in_stack_fffffffffffff990);
        base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff980);
        base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff980);
        in_stack_fffffffffffff990 = (CBlockIndex *)local_188;
        in_stack_fffffffffffff988 = local_188 + 0x20;
        in_stack_fffffffffffff980 = "header %s has prev block invalid: %s\n";
        in_stack_fffffffffffff978 = 1;
        logging_function_02._M_str = in_stack_fffffffffffffa48;
        logging_function_02._M_len = in_stack_fffffffffffffa40;
        source_file_02._M_len._7_1_ = in_stack_fffffffffffffa37;
        source_file_02._M_len._0_7_ = in_stack_fffffffffffffa30;
        source_file_02._M_str = in_stack_fffffffffffffa38;
        LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                  (logging_function_02,source_file_02,iVar12,(LogFlags)in_stack_fffffffffffff9e0,
                   LVar14,in_stack_fffffffffffffa28,in_RSI,in_RDI);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
      }
      BVar11 = (BlockValidationResult)((ulong)in_stack_fffffffffffff990 >> 0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff9c8,
                 (char *)CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0),
                 (allocator<char> *)in_stack_fffffffffffff9b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff9c8,
                 (char *)CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0),
                 (allocator<char> *)in_stack_fffffffffffff9b8);
      bVar3 = ValidationState<BlockValidationResult>::Invalid
                        ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffff998,BVar11,
                         (string *)in_stack_fffffffffffff988,(string *)in_stack_fffffffffffff980);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
      std::allocator<char>::~allocator(&local_3ea);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
      std::allocator<char>::~allocator(local_3e9);
      goto LAB_007e2680;
    }
    bVar2 = ContextualCheckBlockHeader
                      (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0
                       ,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
    iVar12 = (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20);
    if (!bVar2) {
      bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                                  Trace);
      LVar14 = (Level)in_RCX;
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff998,
                   (char *)in_stack_fffffffffffff990);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff998,
                   (char *)in_stack_fffffffffffff990);
        base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff980);
        ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                  ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffff9b8);
        uVar10 = 1;
        logging_function_03._M_str = in_stack_fffffffffffffa48;
        logging_function_03._M_len = in_stack_fffffffffffffa40;
        source_file_03._M_len._7_1_ = in_stack_fffffffffffffa37;
        source_file_03._M_len._0_7_ = in_stack_fffffffffffffa30;
        source_file_03._M_str = in_stack_fffffffffffffa38;
        LogPrintFormatInternal<char[18],std::__cxx11::string,std::__cxx11::string>
                  (logging_function_03,source_file_03,iVar12,(LogFlags)in_stack_fffffffffffff9e0,
                   LVar14,(ConstevalFormatString<3U>)in_stack_fffffffffffffa28.fmt,
                   (char (*) [18])in_RSI,in_RDI,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff97c,uVar10));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff97c,uVar10));
      }
      bVar3 = 0;
      goto LAB_007e2680;
    }
    bVar2 = CBlockIndex::IsValid
                      (in_stack_fffffffffffff990,
                       (BlockStatus)((ulong)in_stack_fffffffffffff988 >> 0x20));
    iVar12 = (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20);
    if (!bVar2) {
      local_418 = (_Base_ptr)
                  std::set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>
                  ::begin((set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>
                           *)in_stack_fffffffffffff980);
      local_420 = (_Base_ptr)
                  std::set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>
                  ::end((set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>
                         *)in_stack_fffffffffffff980);
      while( true ) {
        bVar2 = std::operator==((_Self *)in_stack_fffffffffffff988,
                                (_Self *)in_stack_fffffffffffff980);
        iVar12 = (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20);
        if (((bVar2 ^ 0xffU) & 1) == 0) break;
        ppCVar6 = std::_Rb_tree_const_iterator<CBlockIndex_*>::operator*
                            ((_Rb_tree_const_iterator<CBlockIndex_*> *)
                             CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
        pCVar8 = *ppCVar6;
        pCVar7 = CBlockIndex::GetAncestor
                           ((CBlockIndex *)in_stack_fffffffffffff988,
                            (int)((ulong)in_stack_fffffffffffff980 >> 0x20));
        if (pCVar7 == pCVar8) {
          local_428 = &ppVar5->second;
          if ((pCVar8->nStatus & 0x20) == 0) {
            __assert_fail("failedit->nStatus & BLOCK_FAILED_VALID",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x10f0,
                          "bool ChainstateManager::AcceptBlockHeader(const CBlockHeader &, BlockValidationState &, CBlockIndex **, bool)"
                         );
          }
          while( true ) {
            iVar12 = (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20);
            LVar14 = (Level)in_RCX;
            if (local_428 == pCVar8) break;
            local_428->nStatus = local_428->nStatus | 0x40;
            pVar9 = std::
                    set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>::
                    insert((set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>
                            *)in_stack_fffffffffffff988,(value_type *)in_stack_fffffffffffff980);
            local_338 = (_Base_ptr)pVar9.first._M_node;
            local_330 = pVar9.second;
            local_428 = local_428->pprev;
          }
          bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                                      Trace);
          if (bVar2) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff998
                       ,(char *)in_stack_fffffffffffff990);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff998
                       ,(char *)in_stack_fffffffffffff990);
            pcVar13 = "header %s has prev block invalid: %s\n";
            base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff980);
            base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff980);
            in_stack_fffffffffffff980 = pcVar13;
            in_stack_fffffffffffff990 = (CBlockIndex *)(local_2a8 + 0x60);
            in_stack_fffffffffffff988 = (char *)&local_228;
            in_stack_fffffffffffff978 = 1;
            logging_function_04._M_str = in_stack_fffffffffffffa48;
            logging_function_04._M_len = in_stack_fffffffffffffa40;
            source_file_04._M_len._7_1_ = in_stack_fffffffffffffa37;
            source_file_04._M_len._0_7_ = in_stack_fffffffffffffa30;
            source_file_04._M_str = in_stack_fffffffffffffa38;
            LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                      (logging_function_04,source_file_04,iVar12,(LogFlags)in_stack_fffffffffffff9e0
                       ,LVar14,in_stack_fffffffffffffa28,in_RSI,in_RDI);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
          }
          BVar11 = (BlockValidationResult)((ulong)in_stack_fffffffffffff990 >> 0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff9c8,
                     (char *)CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0),
                     (allocator<char> *)in_stack_fffffffffffff9b8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff9c8,
                     (char *)CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0),
                     (allocator<char> *)in_stack_fffffffffffff9b8);
          bVar3 = ValidationState<BlockValidationResult>::Invalid
                            ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffff998,
                             BVar11,(string *)in_stack_fffffffffffff988,
                             (string *)in_stack_fffffffffffff980);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
          std::allocator<char>::~allocator(&local_44a);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
          std::allocator<char>::~allocator(local_449);
          goto LAB_007e2680;
        }
        std::_Rb_tree_const_iterator<CBlockIndex_*>::operator++
                  ((_Rb_tree_const_iterator<CBlockIndex_*> *)
                   CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
      }
    }
  }
  if ((in_R8B & 1) == 0) {
    bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),Trace)
    ;
    LVar14 = (Level)in_RCX;
    if (bVar2) {
      in_stack_fffffffffffff988 = "AcceptBlockHeader";
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff998,
                 (char *)in_stack_fffffffffffff990);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff998,
                 (char *)in_stack_fffffffffffff990);
      in_stack_fffffffffffff990 = (CBlockIndex *)local_2a8;
      psVar1 = (string *)
               "%s: not adding new block header %s, missing anti-dos proof-of-work validation\n";
      base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff980);
      in_stack_fffffffffffff980 = (char *)psVar1;
      in_stack_fffffffffffff978 = 1;
      logging_function_05._M_str = in_stack_fffffffffffffa48;
      logging_function_05._M_len = in_stack_fffffffffffffa40;
      source_file_05._M_len._7_1_ = in_stack_fffffffffffffa37;
      source_file_05._M_len._0_7_ = in_stack_fffffffffffffa30;
      source_file_05._M_str = in_stack_fffffffffffffa38;
      LogPrintFormatInternal<char[18],std::__cxx11::string>
                (logging_function_05,source_file_05,(int)((ulong)in_stack_fffffffffffff988 >> 0x20),
                 (LogFlags)in_stack_fffffffffffff990,LVar14,in_stack_fffffffffffffa28,
                 (char (*) [18])in_RSI,in_RDI);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
    }
    BVar11 = (BlockValidationResult)((ulong)in_stack_fffffffffffff990 >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff9c8,
               (char *)CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0),
               (allocator<char> *)in_stack_fffffffffffff9b8);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_472;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0),
               (allocator<char> *)in_stack_fffffffffffff9b8);
    bVar3 = ValidationState<BlockValidationResult>::Invalid
                      ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffff998,BVar11,
                       (string *)in_stack_fffffffffffff988,(string *)in_stack_fffffffffffff980);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
    std::allocator<char>::~allocator((allocator<char> *)local_472);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
    std::allocator<char>::~allocator((allocator<char> *)(local_472 + 1));
  }
  else {
    pCVar8 = ::node::BlockManager::AddToBlockIndex
                       (in_stack_fffffffffffff9b8,
                        (CBlockHeader *)
                        CONCAT17(in_stack_fffffffffffff9b7,
                                 CONCAT16(in_stack_fffffffffffff9b6,
                                          CONCAT15(in_stack_fffffffffffff9b5,
                                                   in_stack_fffffffffffff9b0))),
                        in_stack_fffffffffffff9a8);
    if (in_RCX != (undefined8 *)0x0) {
      *in_RCX = pCVar8;
    }
    pcVar13 = local_328;
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff980);
    LVar14 = (Level)in_RCX;
    tinyformat::format<std::__cxx11::string,int>
              (pcVar13,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff9b7,
                                CONCAT16(in_stack_fffffffffffff9b6,
                                         CONCAT15(in_stack_fffffffffffff9b5,
                                                  in_stack_fffffffffffff9b0))),
               (int *)in_stack_fffffffffffff9a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
    bVar2 = IsInitialBlockDownload(in_stack_fffffffffffffa20);
    if (bVar2) {
      bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                                  Trace);
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff998,
                   (char *)in_stack_fffffffffffff990);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff998,
                   (char *)in_stack_fffffffffffff990);
        in_stack_fffffffffffff978 = 1;
        logging_function_06._M_str = in_stack_fffffffffffffa48;
        logging_function_06._M_len = in_stack_fffffffffffffa40;
        source_file_06._M_len._7_1_ = in_stack_fffffffffffffa37;
        source_file_06._M_len._0_7_ = in_stack_fffffffffffffa30;
        source_file_06._M_str = in_stack_fffffffffffffa38;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_06,source_file_06,iVar12,(LogFlags)in_stack_fffffffffffff9e0,
                   LVar14,(ConstevalFormatString<1U>)in_stack_fffffffffffffa28.fmt,in_RSI);
      }
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff998,
                 (char *)in_stack_fffffffffffff990);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff998,
                 (char *)in_stack_fffffffffffff990);
      in_stack_fffffffffffff978 = 2;
      logging_function_07._M_str = in_stack_fffffffffffffa48;
      logging_function_07._M_len = in_stack_fffffffffffffa40;
      source_file_07._M_len._7_1_ = in_stack_fffffffffffffa37;
      source_file_07._M_len._0_7_ = in_stack_fffffffffffffa30;
      source_file_07._M_str = in_stack_fffffffffffffa38;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function_07,source_file_07,iVar12,(LogFlags)in_stack_fffffffffffff9e0,
                 LVar14,(ConstevalFormatString<1U>)in_stack_fffffffffffffa28.fmt,in_RSI);
    }
    bVar3 = 1;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
  }
LAB_007e2680:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool ChainstateManager::AcceptBlockHeader(const CBlockHeader& block, BlockValidationState& state, CBlockIndex** ppindex, bool min_pow_checked)
{
    AssertLockHeld(cs_main);

    // Check for duplicate
    uint256 hash = block.GetHash();
    BlockMap::iterator miSelf{m_blockman.m_block_index.find(hash)};
    if (hash != GetConsensus().hashGenesisBlock) {
        if (miSelf != m_blockman.m_block_index.end()) {
            // Block header is already known.
            CBlockIndex* pindex = &(miSelf->second);
            if (ppindex)
                *ppindex = pindex;
            if (pindex->nStatus & BLOCK_FAILED_MASK) {
                LogDebug(BCLog::VALIDATION, "%s: block %s is marked invalid\n", __func__, hash.ToString());
                return state.Invalid(BlockValidationResult::BLOCK_CACHED_INVALID, "duplicate");
            }
            return true;
        }

        if (!CheckBlockHeader(block, state, GetConsensus())) {
            LogDebug(BCLog::VALIDATION, "%s: Consensus::CheckBlockHeader: %s, %s\n", __func__, hash.ToString(), state.ToString());
            return false;
        }

        // Get prev block index
        CBlockIndex* pindexPrev = nullptr;
        BlockMap::iterator mi{m_blockman.m_block_index.find(block.hashPrevBlock)};
        if (mi == m_blockman.m_block_index.end()) {
            LogDebug(BCLog::VALIDATION, "header %s has prev block not found: %s\n", hash.ToString(), block.hashPrevBlock.ToString());
            return state.Invalid(BlockValidationResult::BLOCK_MISSING_PREV, "prev-blk-not-found");
        }
        pindexPrev = &((*mi).second);
        if (pindexPrev->nStatus & BLOCK_FAILED_MASK) {
            LogDebug(BCLog::VALIDATION, "header %s has prev block invalid: %s\n", hash.ToString(), block.hashPrevBlock.ToString());
            return state.Invalid(BlockValidationResult::BLOCK_INVALID_PREV, "bad-prevblk");
        }
        if (!ContextualCheckBlockHeader(block, state, m_blockman, *this, pindexPrev)) {
            LogDebug(BCLog::VALIDATION, "%s: Consensus::ContextualCheckBlockHeader: %s, %s\n", __func__, hash.ToString(), state.ToString());
            return false;
        }

        /* Determine if this block descends from any block which has been found
         * invalid (m_failed_blocks), then mark pindexPrev and any blocks between
         * them as failed. For example:
         *
         *                D3
         *              /
         *      B2 - C2
         *    /         \
         *  A             D2 - E2 - F2
         *    \
         *      B1 - C1 - D1 - E1
         *
         * In the case that we attempted to reorg from E1 to F2, only to find
         * C2 to be invalid, we would mark D2, E2, and F2 as BLOCK_FAILED_CHILD
         * but NOT D3 (it was not in any of our candidate sets at the time).
         *
         * In any case D3 will also be marked as BLOCK_FAILED_CHILD at restart
         * in LoadBlockIndex.
         */
        if (!pindexPrev->IsValid(BLOCK_VALID_SCRIPTS)) {
            // The above does not mean "invalid": it checks if the previous block
            // hasn't been validated up to BLOCK_VALID_SCRIPTS. This is a performance
            // optimization, in the common case of adding a new block to the tip,
            // we don't need to iterate over the failed blocks list.
            for (const CBlockIndex* failedit : m_failed_blocks) {
                if (pindexPrev->GetAncestor(failedit->nHeight) == failedit) {
                    assert(failedit->nStatus & BLOCK_FAILED_VALID);
                    CBlockIndex* invalid_walk = pindexPrev;
                    while (invalid_walk != failedit) {
                        invalid_walk->nStatus |= BLOCK_FAILED_CHILD;
                        m_blockman.m_dirty_blockindex.insert(invalid_walk);
                        invalid_walk = invalid_walk->pprev;
                    }
                    LogDebug(BCLog::VALIDATION, "header %s has prev block invalid: %s\n", hash.ToString(), block.hashPrevBlock.ToString());
                    return state.Invalid(BlockValidationResult::BLOCK_INVALID_PREV, "bad-prevblk");
                }
            }
        }
    }
    if (!min_pow_checked) {
        LogDebug(BCLog::VALIDATION, "%s: not adding new block header %s, missing anti-dos proof-of-work validation\n", __func__, hash.ToString());
        return state.Invalid(BlockValidationResult::BLOCK_HEADER_LOW_WORK, "too-little-chainwork");
    }
    CBlockIndex* pindex{m_blockman.AddToBlockIndex(block, m_best_header)};

    if (ppindex)
        *ppindex = pindex;

    // Since this is the earliest point at which we have determined that a
    // header is both new and valid, log here.
    //
    // These messages are valuable for detecting potential selfish mining behavior;
    // if multiple displacing headers are seen near simultaneously across many
    // nodes in the network, this might be an indication of selfish mining. Having
    // this log by default when not in IBD ensures broad availability of this data
    // in case investigation is merited.
    const auto msg = strprintf(
        "Saw new header hash=%s height=%d", hash.ToString(), pindex->nHeight);

    if (IsInitialBlockDownload()) {
        LogPrintLevel(BCLog::VALIDATION, BCLog::Level::Debug, "%s\n", msg);
    } else {
        LogPrintf("%s\n", msg);
    }

    return true;
}